

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O0

thecl_t * th06_parse(FILE *in,char *filename,uint version)

{
  undefined8 *__ptr;
  int iVar1;
  list_node_t *local_c8;
  list_node_t *node;
  global_definition_t *def;
  parser_state_t state;
  uint version_local;
  char *filename_local;
  FILE *in_local;
  
  def._0_4_ = 0;
  def._4_4_ = 0xff;
  state.instr_time = 0;
  state.instr_flags._0_1_ = 1;
  state.instr_flags._1_1_ = 0;
  state.instr_flags._3_1_ = 0;
  state.instr_flags._2_1_ = 0;
  state.instr_rank = version;
  state.instr_size._4_4_ = version;
  list_init((list_t *)&state.uses_numbered_subs);
  list_init((list_t *)&state.expressions.tail);
  list_init((list_t *)&state.block_stack.tail);
  state.global_definitions.tail = (list_node_t *)0x0;
  state.scope_stack._0_4_ = 0;
  state.scope_stack._4_4_ = 0;
  state.scope_cnt = 0;
  state.scope_id = 0;
  state.current_sub = (thecl_sub_t *)thecl_new();
  *(uint *)&(state.current_sub)->name = state.instr_size._4_4_;
  state.path_state.path_list.tail = (list_node_t *)th06_find_format;
  state.instr_format = th06_instr_size;
  path_init((path_state_t *)&state.ecl,filename,argv0);
  thecl_yyin = in;
  iVar1 = thecl_yyparse((parser_state_t *)&def);
  if (iVar1 == 0) {
    path_free((path_state_t *)&state.ecl);
    for (local_c8 = state.block_stack.tail; local_c8 != (list_node_t *)0x0;
        local_c8 = local_c8->next) {
      __ptr = (undefined8 *)local_c8->data;
      free((void *)*__ptr);
      free(__ptr);
    }
    list_free_nodes((list_t *)&state.block_stack.tail);
    free(state.global_definitions.tail);
    in_local = (FILE *)state.current_sub;
  }
  else {
    in_local = (FILE *)0x0;
  }
  return (thecl_t *)in_local;
}

Assistant:

static thecl_t*
th06_parse(
    FILE* in,
    char* filename,
    unsigned int version)
{
    parser_state_t state;

    state.instr_time = 0;
    state.instr_rank = 0xff;
    state.instr_flags = 0;
    state.version = version;
    state.uses_numbered_subs = true;
    state.has_overdrive_difficulty = false;
    state.uses_stack_offsets = false;
    state.has_numeric_difficulties = false;
    list_init(&state.expressions);
    list_init(&state.block_stack);
    list_init(&state.global_definitions);
    state.scope_stack = NULL;
    state.scope_cnt = 0;
    state.scope_id = 0;
    state.current_sub = NULL;
    state.ecl = thecl_new();
    state.ecl->version = version;
    state.instr_format = th06_find_format;
    state.instr_size = th06_instr_size;

    path_init(&state.path_state, filename, argv0);

    thecl_yyin = in;

    if (thecl_yyparse(&state) != 0)
        return 0;

    path_free(&state.path_state);

    global_definition_t* def;
    list_for_each(&state.global_definitions, def) {
        free(def->param);
        free(def);
    }
    list_free_nodes(&state.global_definitions);

    free(state.scope_stack);

    return state.ecl;
}